

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-bst.c
# Opt level: O0

pboolean p_tree_bst_insert(PTreeBaseNode **root_node,PCompareDataFunc compare_func,ppointer data,
                          PDestroyFunc key_destroy_func,PDestroyFunc value_destroy_func,ppointer key
                          ,ppointer value)

{
  pint pVar1;
  PTreeBaseNode_ *pPVar2;
  PTreeBaseNode *pPStack_48;
  pint cmp_result;
  PTreeBaseNode **cur_node;
  ppointer key_local;
  PDestroyFunc value_destroy_func_local;
  PDestroyFunc key_destroy_func_local;
  ppointer data_local;
  PCompareDataFunc compare_func_local;
  PTreeBaseNode **root_node_local;
  
  pPStack_48 = (PTreeBaseNode *)root_node;
  while (pPStack_48->left != (PTreeBaseNode *)0x0) {
    pVar1 = (*compare_func)(key,pPStack_48->left->key,data);
    if (pVar1 < 0) {
      pPStack_48 = pPStack_48->left;
    }
    else {
      if (pVar1 < 1) break;
      pPStack_48 = (PTreeBaseNode *)&pPStack_48->left->right;
    }
  }
  if (pPStack_48->left == (PTreeBaseNode_ *)0x0) {
    pPVar2 = (PTreeBaseNode_ *)p_malloc0(0x20);
    pPStack_48->left = pPVar2;
    if (pPVar2 == (PTreeBaseNode_ *)0x0) {
      root_node_local._4_4_ = 0;
    }
    else {
      pPStack_48->left->key = key;
      pPStack_48->left->value = value;
      root_node_local._4_4_ = 1;
    }
  }
  else {
    if (key_destroy_func != (PDestroyFunc)0x0) {
      (*key_destroy_func)(pPStack_48->left->key);
    }
    if (value_destroy_func != (PDestroyFunc)0x0) {
      (*value_destroy_func)(pPStack_48->left->value);
    }
    pPStack_48->left->key = key;
    pPStack_48->left->value = value;
    root_node_local._4_4_ = 0;
  }
  return root_node_local._4_4_;
}

Assistant:

pboolean
p_tree_bst_insert (PTreeBaseNode	**root_node,
		   PCompareDataFunc	compare_func,
		   ppointer		data,
		   PDestroyFunc		key_destroy_func,
		   PDestroyFunc		value_destroy_func,
		   ppointer		key,
		   ppointer		value)
{
	PTreeBaseNode	**cur_node;
	pint		cmp_result;

	cur_node = root_node;

	while (*cur_node != NULL) {
		cmp_result = compare_func (key, (*cur_node)->key, data);

		if (cmp_result < 0)
			cur_node = &(*cur_node)->left;
		else if (cmp_result > 0)
			cur_node = &(*cur_node)->right;
		else
			break;
	}

	if ((*cur_node) == NULL) {
		if (P_UNLIKELY ((*cur_node = p_malloc0 (sizeof (PTreeBaseNode))) == NULL))
			return FALSE;

		(*cur_node)->key   = key;
		(*cur_node)->value = value;

		return TRUE;
	} else {
		if (key_destroy_func != NULL)
			key_destroy_func ((*cur_node)->key);

		if (value_destroy_func != NULL)
			value_destroy_func ((*cur_node)->value);

		(*cur_node)->key   = key;
		(*cur_node)->value = value;

		return FALSE;
	}
}